

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,MessageLite *extendee,ExtensionSet *extension_set,int number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  int cached_size;
  uint8_t *puVar1;
  MessageLite *pMVar2;
  LogMessage local_40;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 2) == 0) {
      puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar1 = io::CodedOutputStream::WriteVarint32ToArray(0xb,puVar1);
      puVar1 = WireFormatLite::WriteUInt32ToArray(2,number,puVar1);
      if ((this->field_0xa & 4) == 0) {
        this_00 = this->field_0;
        cached_size = MessageLite::GetCachedSize(this_00);
        puVar1 = WireFormatLite::InternalWriteMessage
                           (3,(MessageLite *)this_00,cached_size,puVar1,stream);
      }
      else {
        pMVar2 = GetPrototypeForLazyMessage(extension_set,extendee,number);
        puVar1 = (uint8_t *)
                 (**(code **)(**(long **)&(this->field_0).int32_t_value + 0xa0))
                           (*(long **)&(this->field_0).int32_t_value,pMVar2,3,puVar1,stream);
      }
      puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar1);
      puVar1 = io::CodedOutputStream::WriteVarint32ToArray(0xc,puVar1);
      return puVar1;
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x7f1);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_40,(char (*) [31])"Invalid message set extension.");
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_40);
    target = InternalSerializeFieldWithCachedSizesToArray
                       (this,extendee,extension_set,number,target,stream);
  }
  return target;
}

Assistant:

uint8_t*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    const MessageLite* extendee, const ExtensionSet* extension_set, int number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    ABSL_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(extendee, extension_set,
                                                        number, target, stream);
  }

  if (is_cleared) return target;

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    const auto* prototype =
        extension_set->GetPrototypeForLazyMessage(extendee, number);
    target = ptr.lazymessage_value->WriteMessageToArray(
        prototype, WireFormatLite::kMessageSetMessageNumber, target, stream);
  } else {
    target = WireFormatLite::InternalWriteMessage(
        WireFormatLite::kMessageSetMessageNumber, *ptr.message_value,
        ptr.message_value->GetCachedSize(), target, stream);
  }
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}